

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O1

void __thiscall
wabt::LoadStoreTracking::LoadStore
          (LoadStoreTracking *this,uint64_t offset,Opcode opc,Type type,Address align,Node *addr_exp
          )

{
  short sVar1;
  Enum EVar2;
  Address AVar3;
  undefined8 uVar4;
  bool bVar5;
  size_t sVar6;
  Type TVar7;
  mapped_type *this_00;
  mapped_type *pmVar8;
  long lVar9;
  long extraout_RDX;
  ulong uVar10;
  Type TVar11;
  Address AVar12;
  char *pcVar13;
  string name;
  Opcode local_a0;
  Opcode local_9c;
  Node *local_98;
  Address local_90;
  Address local_88;
  uint64_t local_80;
  undefined1 local_78 [48];
  Address local_48;
  
  uVar10 = 0xffffffff00000000;
  local_a0.enum_ = opc.enum_;
  local_88 = align;
  local_80 = offset;
  Opcode::GetInfo((Info *)local_78,&local_a0);
  local_9c.enum_ = local_a0.enum_;
  if ((type.enum_ & I64) == I64) {
    local_90 = local_48;
    local_98 = addr_exp;
    Opcode::GetInfo((Info *)local_78,&local_9c);
    uVar4 = local_78._0_8_;
    sVar6 = strlen((char *)local_78._0_8_);
    if (sVar6 < 2) {
      pcVar13 = "%s: __pos (which is %zu) > __size (which is %zu)";
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 sVar6 - 2,sVar6);
      if (*(int *)(extraout_RDX + 4) == 0x1a) {
        lVar9 = *(long *)(extraout_RDX + 8);
        if (*(int *)(lVar9 + 0x38) != 0x1a) {
          pcVar13 = 
          "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::LocalTee>, Base = wabt::Expr]"
          ;
          goto LAB_001326aa;
        }
      }
      else {
        if (*(int *)(extraout_RDX + 4) != 0x18) {
          *(string **)pcVar13 = (string *)pcVar13 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)pcVar13,"");
          return;
        }
        lVar9 = *(long *)(extraout_RDX + 8);
        if (*(int *)(lVar9 + 0x38) != 0x18) {
          pcVar13 = 
          "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::LocalGet>, Base = wabt::Expr]"
          ;
LAB_001326aa:
          __assert_fail("isa<Derived>(base)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/cast.h"
                        ,0x48,pcVar13);
        }
      }
      if (*(int *)(lVar9 + 0x60) == 1) {
        *(string **)pcVar13 = (string *)pcVar13 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)pcVar13,*(long *)(lVar9 + 0x68),
                   *(long *)(lVar9 + 0x70) + *(long *)(lVar9 + 0x68));
        return;
      }
      __assert_fail("is_name()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/ir.h"
                    ,0x3e,"const std::string &wabt::Var::name() const");
    }
    TVar7.enum_ = I16;
    TVar7.type_index_ = 0;
    sVar1 = *(short *)(uVar4 + (sVar6 - 2));
    Opcode::GetInfo((Info *)local_78,&local_9c);
    if (local_48 == 4) {
      TVar11.enum_ = I32;
      TVar11.type_index_ = 0;
      TVar7.enum_ = I32U;
      TVar7.type_index_ = 0;
LAB_001324bc:
      if (sVar1 != 0x755f) {
        TVar7 = TVar11;
      }
      bVar5 = false;
    }
    else if (local_48 == 2) {
      if (sVar1 == 0x755f) {
        TVar7.enum_ = I16U;
        TVar7.type_index_ = 0;
      }
      bVar5 = false;
    }
    else {
      if (local_48 == 1) {
        TVar11.enum_ = I8;
        TVar11.type_index_ = 0;
        TVar7.enum_ = I8U;
        TVar7.type_index_ = 0;
        goto LAB_001324bc;
      }
      bVar5 = true;
      TVar7.enum_ = Any;
      TVar7.type_index_ = 0;
    }
    local_48 = local_90;
    AVar12 = local_90;
    addr_exp = local_98;
    if (!bVar5) goto LAB_001324de;
  }
  uVar10 = (ulong)type & 0xffffffff00000000;
  AVar12 = local_48;
  TVar7 = type;
LAB_001324de:
  AddrExpName_abi_cxx11_((string *)local_78,this,addr_exp);
  if ((char *)local_78._8_8_ != (char *)0x0) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
              ::operator[](&this->vars,(key_type *)local_78);
    pmVar8 = std::
             map<unsigned_long,_wabt::LoadStoreTracking::LSAccess,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>_>
             ::operator[](&this_00->accesses,&local_80);
    AVar3 = local_88;
    if ((pmVar8->byte_size != 0) &&
       (((pmVar8->byte_size != AVar12 || ((pmVar8->type).enum_ != TVar7.enum_)) ||
        (pmVar8->align != local_88)))) {
      pmVar8->is_uniform = false;
    }
    bVar5 = Opcode::IsNaturallyAligned(&local_a0,local_88);
    if (!bVar5) {
      pmVar8->is_uniform = false;
    }
    pmVar8->byte_size = AVar12;
    TVar11 = (Type)(uVar10 | (ulong)TVar7 & 0xffffffff);
    pmVar8->type = TVar11;
    pmVar8->align = AVar3;
    EVar2 = (this_00->same_type).enum_;
    if ((EVar2 == TVar7.enum_ || EVar2 == Any) &&
       (this_00->same_align == AVar3 || this_00->same_align == 0xffffffffffffffff)) {
      this_00->same_type = TVar11;
      this_00->same_align = AVar3;
      (this_00->last_opc).enum_ = local_a0.enum_;
    }
    else {
      (this_00->same_type).enum_ = Void;
      (this_00->same_type).type_index_ = 0xffffffff;
      this_00->same_align = 0xffffffffffffffff;
    }
  }
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  return;
}

Assistant:

void LoadStore(uint64_t offset,
                 Opcode opc,
                 Type type,
                 Address align,
                 const Node& addr_exp) {
    auto byte_size = opc.GetMemorySize();
    type = GetMemoryType(type, opc);
    // We want to associate memory ops of a certain offset & size as being
    // relative to a uniquely identifiable pointer, such as a local.
    auto name = AddrExpName(addr_exp);
    if (name.empty()) {
      return;
    }
    auto& var = vars[name];
    auto& access = var.accesses[offset];
    // Check if previous access at this offset (if any) is of same size
    // and type (see Checklayouts below).
    if (access.byte_size && ((access.byte_size != byte_size) ||
                             (access.type != type) || (access.align != align)))
      access.is_uniform = false;
    // Also exclude weird alignment accesses from structs.
    if (!opc.IsNaturallyAligned(align))
      access.is_uniform = false;
    access.byte_size = byte_size;
    access.type = type;
    access.align = align;
    // Additionally, check if all accesses are to the same type, so
    // if layout check fails, we can at least declare it as pointer to
    // a type.
    if ((var.same_type == type || var.same_type == Type::Any) &&
        (var.same_align == align || var.same_align == kInvalidAddress)) {
      var.same_type = type;
      var.same_align = align;
      var.last_opc = opc;
    } else {
      var.same_type = Type::Void;
      var.same_align = kInvalidAddress;
    }
  }